

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapGrowBucket(jx9_hashmap *pMap)

{
  jx9_hashmap_node **pChunk;
  uint uVar1;
  jx9_hashmap_node **pSrc;
  uint local_3c;
  sxu32 n;
  sxu32 nBucket;
  sxu32 nNew;
  jx9_hashmap_node **apNew;
  jx9_hashmap_node *pEntry;
  jx9_hashmap_node **apOld;
  jx9_hashmap *pMap_local;
  
  if (pMap->nSize * 3 <= pMap->nEntry) {
    pChunk = pMap->apBucket;
    n = pMap->nSize << 1;
    if (n == 0) {
      n = 0x10;
    }
    pSrc = (jx9_hashmap_node **)SyMemBackendAlloc(&pMap->pVm->sAllocator,n << 3);
    if (pSrc == (jx9_hashmap_node **)0x0) {
      if (pMap->nSize == 0) {
        return -1;
      }
      return 0;
    }
    SyZero(pSrc,n << 3);
    pMap->apBucket = pSrc;
    pMap->nSize = n;
    if (pChunk == (jx9_hashmap_node **)0x0) {
      return 0;
    }
    apNew = (jx9_hashmap_node **)pMap->pFirst;
    for (local_3c = 0; local_3c < pMap->nEntry; local_3c = local_3c + 1) {
      apNew[0xb] = (jx9_hashmap_node *)0x0;
      apNew[10] = (jx9_hashmap_node *)0x0;
      uVar1 = *(uint *)((long)apNew + 0x34) & n - 1;
      if (pMap->apBucket[uVar1] != (jx9_hashmap_node *)0x0) {
        apNew[10] = pMap->apBucket[uVar1];
        pMap->apBucket[uVar1]->pPrevCollide = (jx9_hashmap_node *)apNew;
      }
      pMap->apBucket[uVar1] = (jx9_hashmap_node *)apNew;
      apNew = (jx9_hashmap_node **)apNew[9];
    }
    SyMemBackendFree(&pMap->pVm->sAllocator,pChunk);
  }
  return 0;
}

Assistant:

static sxi32 HashmapGrowBucket(jx9_hashmap *pMap)
{
	if( pMap->nEntry >= pMap->nSize * HASHMAP_FILL_FACTOR ){
		jx9_hashmap_node **apOld = pMap->apBucket;
		jx9_hashmap_node *pEntry, **apNew;
		sxu32 nNew = pMap->nSize << 1;
		sxu32 nBucket;
		sxu32 n;
		if( nNew < 1 ){
			nNew = 16;
		}
		/* Allocate a new bucket */
		apNew = (jx9_hashmap_node **)SyMemBackendAlloc(&pMap->pVm->sAllocator, nNew * sizeof(jx9_hashmap_node *));
		if( apNew == 0 ){
			if( pMap->nSize < 1 ){
				return SXERR_MEM; /* Fatal */
			}
			/* Not so fatal here, simply a performance hit */
			return SXRET_OK;
		}
		/* Zero the table */
		SyZero((void *)apNew, nNew * sizeof(jx9_hashmap_node *));
		/* Reflect the change */
		pMap->apBucket = apNew;
		pMap->nSize = nNew;
		if( apOld == 0 ){
			/* First allocated table [i.e: no entry], return immediately */
			return SXRET_OK;
		}
		/* Rehash old entries */
		pEntry = pMap->pFirst;
		n = 0;
		for( ;; ){
			if( n >= pMap->nEntry ){
				break;
			}
			/* Clear the old collision link */
			pEntry->pNextCollide = pEntry->pPrevCollide = 0;
			/* Link to the new bucket */
			nBucket = pEntry->nHash & (nNew - 1);
			if( pMap->apBucket[nBucket] != 0 ){
				pEntry->pNextCollide = pMap->apBucket[nBucket];
				pMap->apBucket[nBucket]->pPrevCollide = pEntry;
			}
			pMap->apBucket[nBucket] = pEntry;
			/* Point to the next entry */
			pEntry = pEntry->pPrev; /* Reverse link */
			n++;
		}
		/* Free the old table */
		SyMemBackendFree(&pMap->pVm->sAllocator, (void *)apOld);
	}
	return SXRET_OK;
}